

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void do_fmla_zpzzz_h(CPUARMState_conflict *env,void *vg,uint32_t desc,uint16_t neg1,uint16_t neg3)

{
  ulong uVar1;
  float16 fVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  float16 r;
  float16 e3;
  float16 e2;
  float16 e1;
  uint64_t pg;
  uint64_t *g;
  void *va;
  void *vm;
  void *vn;
  void *vd;
  uint ra;
  uint rm;
  uint rn;
  uint rd;
  intptr_t i;
  uint16_t neg3_local;
  uint16_t neg1_local;
  uint32_t desc_local;
  void *vg_local;
  CPUARMState_conflict *env_local;
  
  _rn = simd_oprsz(desc);
  uVar3 = extract32(desc,10,5);
  uVar4 = extract32(desc,0xf,5);
  uVar5 = extract32(desc,0x14,5);
  uVar6 = extract32(desc,0x19,5);
  do {
    uVar1 = *(ulong *)((long)vg + ((long)(_rn - 1) >> 6) * 8);
    do {
      _rn = _rn - 2;
      if ((uVar1 >> ((byte)_rn & 0x3f) & 1) != 0) {
        fVar2 = float16_muladd_aarch64
                          (*(ushort *)((long)(env->vfp).zregs[uVar4].d + _rn) ^ neg1,
                           *(float16 *)((long)(env->vfp).zregs[uVar5].d + _rn),
                           *(ushort *)((long)(env->vfp).zregs[uVar6].d + _rn) ^ neg3,0,
                           &(env->vfp).fp_status_f16);
        *(float16 *)((long)(env->vfp).zregs[uVar3].d + _rn) = fVar2;
      }
    } while ((_rn & 0x3f) != 0);
  } while (_rn != 0);
  return;
}

Assistant:

static void do_fmla_zpzzz_h(CPUARMState *env, void *vg, uint32_t desc,
                            uint16_t neg1, uint16_t neg3)
{
    intptr_t i = simd_oprsz(desc);
    unsigned rd = extract32(desc, SIMD_DATA_SHIFT, 5);
    unsigned rn = extract32(desc, SIMD_DATA_SHIFT + 5, 5);
    unsigned rm = extract32(desc, SIMD_DATA_SHIFT + 10, 5);
    unsigned ra = extract32(desc, SIMD_DATA_SHIFT + 15, 5);
    void *vd = &env->vfp.zregs[rd];
    void *vn = &env->vfp.zregs[rn];
    void *vm = &env->vfp.zregs[rm];
    void *va = &env->vfp.zregs[ra];
    uint64_t *g = vg;

    do {
        uint64_t pg = g[(i - 1) >> 6];
        do {
            i -= 2;
            if (likely((pg >> (i & 63)) & 1)) {
                float16 e1, e2, e3, r;

                e1 = *(uint16_t *)((char *)vn + H1_2(i)) ^ neg1;
                e2 = *(uint16_t *)((char *)vm + H1_2(i));
                e3 = *(uint16_t *)((char *)va + H1_2(i)) ^ neg3;
                r = float16_muladd(e1, e2, e3, 0, &env->vfp.fp_status_f16);
                *(uint16_t *)((char *)vd + H1_2(i)) = r;
            }
        } while (i & 63);
    } while (i != 0);
}